

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-0.c
# Opt level: O0

int CheckFromArray(void)

{
  char *__s1;
  int iVar1;
  size_t __n;
  char *local_a0;
  char *status;
  char buf [128];
  FILE *out;
  
  buf._120_8_ = fopen("out.txt","r");
  if ((FILE *)buf._120_8_ == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    out._4_4_ = 0xffffffff;
  }
  else {
    memset(&status,0,0x80);
    local_a0 = ScanChars((FILE *)buf._120_8_,0x80,(char *)&status);
    fclose((FILE *)buf._120_8_);
    if (local_a0 == "PASSED") {
      __s1 = testInOut[testN].out;
      __n = strlen(testInOut[testN].out);
      iVar1 = strncasecmp(__s1,(char *)&status,__n);
      if (iVar1 != 0) {
        local_a0 = "FAILED";
      }
    }
    if (local_a0 == "PASSED") {
      iVar1 = HaveGarbageAtTheEnd((FILE *)buf._120_8_);
      if (iVar1 != 0) {
        local_a0 = "FAILED";
      }
    }
    printf("%s\n",local_a0);
    out._4_4_ = (uint)(local_a0 == "FAILED");
  }
  testN = testN + 1;
  return out._4_4_;
}

Assistant:

static int CheckFromArray(void) 
{
    FILE* const out = fopen("out.txt", "r");
    if (out == NULL) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    char buf[128] = {0};
    const char* status = ScanChars(out, sizeof(buf), buf);
    fclose(out);
    if (status == Pass && _strnicmp(testInOut[testN].out, buf, strlen(testInOut[testN].out)) != 0) {
        status = Fail;
    }
    if (status == Pass && HaveGarbageAtTheEnd(out)) {
        status = Fail;
    }
    printf("%s\n", status);
    ++testN;
    return status == Fail;
}